

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O1

void gen_op_evsubf(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  uc_struct_conflict11 *val;
  void *pvVar1;
  uint64_t val_00;
  uintptr_t o_1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  uintptr_t o;
  uintptr_t o_6;
  list_item *plVar6;
  uintptr_t o_2;
  list_item *plVar7;
  uintptr_t o_3;
  bool bVar8;
  TCGTemp *local_68;
  TCGv_i32 local_60;
  TCGv_i32 local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = tcg_ctx->uc;
  plVar7 = val->hook[0x10].head;
  bVar8 = plVar7 != (list_item *)0x0;
  if (bVar8) {
    plVar6 = plVar7;
    do {
      pvVar1 = plVar6->data;
      if ((((*(ulong *)((long)pvVar1 + 0x18) <= tcg_ctx->pc_start) &&
           (tcg_ctx->pc_start <= *(ulong *)((long)pvVar1 + 0x20))) ||
          (*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18))) &&
         (*(char *)((long)pvVar1 + 0x14) != '\x01')) break;
      plVar6 = plVar6->next;
      bVar8 = plVar6 != (list_item *)0x0;
    } while (bVar8);
  }
  if (!(bool)(~bVar8 & 1U | plVar7 == (list_item *)0x0)) {
    do {
      pvVar1 = plVar7->data;
      if (pvVar1 == (void *)0x0) break;
      if (((*(char *)((long)pvVar1 + 0x14) == '\0') && (*(int *)((long)pvVar1 + 0xc) == 0)) &&
         (*(int *)((long)pvVar1 + 0x10) == 0)) {
        val_00 = tcg_ctx->pc_start;
        pTVar2 = tcg_const_i64_ppc64(tcg_ctx,(int64_t)pvVar1);
        pTVar3 = tcg_const_i64_ppc64(tcg_ctx,(int64_t)val);
        pTVar4 = tcg_const_i64_ppc64(tcg_ctx,val_00);
        pTVar5 = tcg_const_i32_ppc64(tcg_ctx,0x20);
        local_68 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
        local_60 = arg2 + (long)&tcg_ctx->pool_cur;
        local_58 = arg1 + (long)&tcg_ctx->pool_cur;
        local_50 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
        local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
        local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        tcg_gen_callN_ppc64(tcg_ctx,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      }
      plVar7 = plVar7->next;
    } while (plVar7 != (list_item *)0x0);
  }
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_sub_i32,(TCGArg)(ret + (long)tcg_ctx),
                    (TCGArg)(arg2 + (long)tcg_ctx),(TCGArg)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_evsubf(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    tcg_gen_sub_i32(tcg_ctx, ret, arg2, arg1);
}